

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

bool llvm::sys::path::remove_dots(SmallVectorImpl<char> *path,bool remove_dot_dot,Style style)

{
  bool bVar1;
  pointer data;
  size_t length;
  Style in_R9D;
  StringRef path_00;
  undefined1 local_140 [8];
  SmallString<256U> result;
  StringRef p;
  Style style_local;
  bool remove_dot_dot_local;
  SmallVectorImpl<char> *path_local;
  
  data = SmallVectorTemplateCommon<char,_void>::data((SmallVectorTemplateCommon<char,_void> *)path);
  length = SmallVectorBase::size((SmallVectorBase *)path);
  StringRef::StringRef
            ((StringRef *)
             (result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.InlineElts +
             0xf8),data,length);
  path_00.Length._0_4_ = remove_dot_dot & 1;
  path_00.Data = p.Data;
  path_00.Length._4_4_ = 0;
  remove_dots((SmallString<256U> *)local_140,
              (path *)result.super_SmallVector<char,_256U>.super_SmallVectorStorage<char,_256U>.
                      InlineElts._248_8_,path_00,SUB41(style,0),in_R9D);
  bVar1 = SmallVectorImpl<char>::operator==((SmallVectorImpl<char> *)local_140,path);
  if (!bVar1) {
    SmallVectorImpl<char>::swap(path,(SmallVectorImpl<char> *)local_140);
  }
  path_local._7_1_ = !bVar1;
  SmallString<256U>::~SmallString((SmallString<256U> *)local_140);
  return path_local._7_1_;
}

Assistant:

bool remove_dots(SmallVectorImpl<char> &path, bool remove_dot_dot,
                 Style style) {
  StringRef p(path.data(), path.size());

  SmallString<256> result = remove_dots(p, remove_dot_dot, style);
  if (result == path)
    return false;

  path.swap(result);
  return true;
}